

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void matchit::impl::IdUtil<mathiu::impl::PieceWise>::bindValue<mathiu::impl::PieceWise_const&>
               (PieceWise *v,PieceWise *value)

{
  PieceWise *local_48;
  variant<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  local_40;
  PieceWise *local_20;
  PieceWise *value_local;
  ValueVariant<mathiu::impl::PieceWise> *v_local;
  
  local_48 = value;
  local_20 = value;
  value_local = v;
  std::
  variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>
  ::variant<mathiu::impl::PieceWise_const*,void,void,mathiu::impl::PieceWise_const*,void>
            ((variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>
              *)&local_40,&local_48);
  std::
  variant<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::operator=((variant<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
               *)value_local,&local_40);
  std::
  variant<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::~variant(&local_40);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }